

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::BinarySequenceExprSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((kind != AndSequenceExpr) && (kind != IntersectSequenceExpr)) && (kind != OrSequenceExpr))
     && ((kind != ThroughoutSequenceExpr && (kind != WithinSequenceExpr)))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool BinarySequenceExprSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AndSequenceExpr:
        case SyntaxKind::IntersectSequenceExpr:
        case SyntaxKind::OrSequenceExpr:
        case SyntaxKind::ThroughoutSequenceExpr:
        case SyntaxKind::WithinSequenceExpr:
            return true;
        default:
            return false;
    }
}